

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

bool32 rw::ps2::rasterFromImage(Raster *raster,Image *image)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool32 bVar4;
  uint8 *puVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint dststride;
  int iVar9;
  long lVar10;
  uint8 *in;
  uint8 *puVar11;
  
  iVar9 = image->depth;
  uVar6 = iVar9 << 0x1e | iVar9 - 4U >> 2;
  if (7 < uVar6) goto switchD_0012b26b_caseD_2;
  lVar10 = (long)nativeRasterOffset;
  switch(uVar6) {
  case 0:
    if (raster->format != 0x4500) goto switchD_0012b26b_caseD_2;
    iVar8 = 0x10;
LAB_0012b2ad:
    bVar3 = true;
    break;
  case 1:
    if (raster->format == 0x2500) {
      iVar8 = 0x100;
      goto LAB_0012b2ad;
    }
  default:
switchD_0012b26b_caseD_2:
    rasterFromImage();
    goto LAB_0012b4c6;
  case 3:
    bVar3 = false;
    iVar8 = 0;
    if (raster->format != 0x100) goto switchD_0012b26b_caseD_2;
    break;
  case 5:
  case 7:
    bVar3 = false;
    if (raster->format == 0x500) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      if (raster->format != 0x600) goto switchD_0012b26b_caseD_2;
    }
  }
  if ((raster->format & 0xf00U) == 0x600) {
    rasterFromImage();
LAB_0012b4c6:
    bVar4 = 0;
  }
  else {
    if (iVar9 < 9) {
      puVar11 = image->palette;
      puVar5 = Raster::lockPalette(raster,5);
      memcpy(puVar5,puVar11,(ulong)(uint)(iVar8 * 4));
      if (bVar3) {
        lVar7 = 0;
        do {
          puVar5[lVar7 * 4 + 3] = (uint8)((uint)puVar5[lVar7 * 4 + 3] * 0x404080 >> 0x17);
          lVar7 = lVar7 + 1;
        } while (iVar8 + (uint)(iVar8 == 0) != (int)lVar7);
      }
      Raster::unlockPalette(raster);
    }
    bVar1 = *(byte *)((long)&raster->pixels + lVar10 + 4);
    uVar6 = 8;
    if (image->depth != 4) {
      uVar6 = (bVar1 & 2) * 4 + 8;
    }
    dststride = 0x20;
    if ((bVar1 & 4) == 0) {
      dststride = uVar6;
    }
    if (image->depth != 4) {
      dststride = uVar6;
    }
    if ((int)dststride < image->width) {
      dststride = image->width;
    }
    puVar11 = image->pixels;
    puVar5 = Raster::lock(raster,0,5);
    if (image->depth == 4) {
      compressPal4(puVar5,dststride >> 1,puVar11,image->stride,image->width,image->height);
    }
    else if (image->depth == 8) {
      copyPal8(puVar5,dststride,puVar11,image->stride,image->width,image->height);
    }
    else if (0 < image->height) {
      iVar9 = 0;
      do {
        if (0 < image->width) {
          iVar8 = 0;
          in = puVar11;
          do {
            iVar2 = image->depth;
            if (iVar2 == 0x20) {
              *puVar5 = *in;
              puVar5[1] = in[1];
              puVar5[2] = in[2];
              puVar5[3] = (uint8)((uint)in[3] * 0x404080 >> 0x17);
LAB_0012b478:
              puVar5 = puVar5 + 4;
            }
            else {
              if (iVar2 == 0x18) {
                *puVar5 = *in;
                puVar5[1] = in[1];
                puVar5[2] = in[2];
                puVar5[3] = 0x80;
                goto LAB_0012b478;
              }
              if (iVar2 == 0x10) {
                conv_ABGR1555_from_ARGB1555(puVar5,in);
                puVar5 = puVar5 + 2;
              }
            }
            in = in + image->bpp;
            iVar8 = iVar8 + 1;
          } while (iVar8 < image->width);
        }
        puVar11 = puVar11 + image->stride;
        iVar9 = iVar9 + 1;
      } while (iVar9 < image->height);
    }
    Raster::unlock(raster,0);
    bVar4 = 1;
  }
  return bVar4;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 pallength = 0;
	switch(image->depth){
	case 24:
	case 32:
		if(raster->format != Raster::C8888 &&
		   raster->format != Raster::C888)	// unsafe already
			goto err;
		break;
	case 16:
		if(raster->format != Raster::C1555) goto err;
		break;
	case 8:
		if(raster->format != (Raster::PAL8 | Raster::C8888)) goto err;
		pallength = 256;
		break;
	case 4:
		if(raster->format != (Raster::PAL4 | Raster::C8888)) goto err;
		pallength = 16;
		break;
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	// unsafe
	if((raster->format&0xF00) == Raster::C888){
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	if(image->depth <= 8){
		in = image->palette;
		out = raster->lockPalette(Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		memcpy(out, in, 4*pallength);
		for(int32 i = 0; i < pallength; i++){
			out[3] = out[3]*128/255;
			out += 4;
		}
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(image->depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(image->width, minw);
	uint8 *src = image->pixels;
	out = raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
	if(image->depth == 4){
		compressPal4(out, tw/2, src, image->stride, image->width, image->height);
	}else if(image->depth == 8){
		copyPal8(out, tw, src, image->stride, image->width, image->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			in = src;
			for(int32 x = 0; x < image->width; x++){
				switch(image->depth){
				case 16:
					conv_ARGB1555_from_ABGR1555(out, in);
					out += 2;
					break;
				case 24:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = 0x80;
					out += 4;
					break;
				case 32:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*128/255;
					out += 4;
					break;
				}
				in += image->bpp;
			}
			src += image->stride;
		}
	}
	raster->unlock(0);
	return 1;
}